

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  long lVar2;
  
  lVar2 = -0x420;
  do {
    *(undefined4 *)((long)this->trans[0][0] + lVar2 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->trans[0][0] + lVar2) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar2 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar2) = 0xfffffffe;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0);
  lVar2 = -0xc;
  do {
    piVar1 = this->trans[0][0] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[1][1] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[1][0] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[0][1] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0);
  return 0;
}

Assistant:

void GameBoard::init()
{
    int i;
    for (i = 0; i < MAPHEIGHT + 2; i++) {
        gridInfo[1][i][0] = gridInfo[1][i][MAPWIDTH + 1] = -2;
        gridInfo[0][i][0] = gridInfo[0][i][MAPWIDTH + 1] = -2;
    }
    for (i = 0; i < MAPWIDTH + 2; i++) {
        gridInfo[1][0][i] = gridInfo[1][MAPHEIGHT + 1][i] = -2;
        gridInfo[0][0][i] = gridInfo[0][MAPHEIGHT + 1][i] = -2;
    }
}